

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Sampling_CatmullRom_Test::TestBody(Sampling_CatmullRom_Test *this)

{
  undefined1 auVar1 [16];
  Allocator AVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  span<const_float> f;
  span<const_float> values_00;
  span<const_float> f_00;
  span<const_float> x;
  span<const_float> x_00;
  span<float> cdf_00;
  span<const_float> F;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  Float local_160;
  float local_15c;
  Float dp;
  Float cp;
  AssertHelper local_150;
  AssertionResult gtest_ar;
  vector<float,_std::allocator<float>_> values;
  vector<float,_std::allocator<float>_> cdf;
  vector<float,_std::allocator<float>_> nodes;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_f0;
  Uniform1DIter __begin1;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  PiecewiseConstant1D distrib;
  Uniform1DIter __end1;
  
  distrib.func.nAlloc._0_4_ = 0x3f800000;
  distrib.func.alloc.memoryResource = (memory_resource *)0x3dcccccd00000000;
  distrib.func.ptr = (float *)0x3f6147ae3ecccccd;
  __l._M_len = 5;
  __l._M_array = (iterator)&distrib;
  std::vector<float,_std::allocator<float>_>::vector(&nodes,__l,(allocator_type *)&local_f0);
  distrib.func.nAlloc._0_4_ = 0x40a00000;
  distrib.func.alloc.memoryResource = (memory_resource *)0x40a0000000000000;
  distrib.func.ptr = (float *)0x4120000040000000;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&distrib;
  std::vector<float,_std::allocator<float>_>::vector(&values,__l_00,(allocator_type *)&local_f0);
  std::vector<float,_std::allocator<float>_>::vector
            (&cdf,(long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2,(allocator_type *)&distrib);
  x.n = (long)nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start >> 2;
  values_00.n = (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
  cdf_00.n = (long)cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
  values_00.ptr =
       values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start;
  x.ptr = nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start;
  cdf_00.ptr = cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
               ._M_start;
  pbrt::IntegrateCatmullRom(x,values_00,cdf_00);
  local_a0 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:753:15)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:753:15)>
             ::_M_manager;
  local_b8._M_unused._M_object = &nodes;
  local_b8._8_8_ = &values;
  AVar2.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Sample1DFunction(&local_f0,(function<float_(float)> *)&local_b8,0x2000,0x400,0.0,1.0,AVar2);
  AVar2.memoryResource = pstd::pmr::new_delete_resource();
  f.n = local_f0.nStored;
  f.ptr = local_f0.ptr;
  pbrt::PiecewiseConstant1D::PiecewiseConstant1D(&distrib,f,AVar2);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  local_f0.alloc.memoryResource._0_4_ = 100;
  local_f0.ptr = (float *)0x0;
  local_f0.nAlloc = 0x853c49e6748fea9b;
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
            (&__begin1,(IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)&local_f0)
  ;
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
            (&__end1,(IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)&local_f0);
  for (; __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
         super_IndexingIterator<pbrt::detail::Uniform1DIter>.i !=
         __end1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
         super_IndexingIterator<pbrt::detail::Uniform1DIter>.i;
      __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
      super_IndexingIterator<pbrt::detail::Uniform1DIter>.i =
           __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
           super_IndexingIterator<pbrt::detail::Uniform1DIter>.i + 1) {
    local_160 = pbrt::RNG::Uniform<float>
                          (&__begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng);
    x_00.n = (long)nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    f_00.n = (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    F.n = (long)cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
    f_00.ptr = values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    x_00.ptr = nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    F.ptr = cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start;
    local_15c = pbrt::SampleCatmullRom(x_00,f_00,F,local_160,(Float *)0x0,&cp);
    local_160 = pbrt::PiecewiseConstant1D::Sample(&distrib,local_160,&dp,(int *)0x0);
    local_168.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x3f689374bc6a7efa;
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar4 = vandps_avx512vl(ZEXT416((uint)(local_15c - local_160)),auVar4);
    local_150.data_._0_4_ = auVar4._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&gtest_ar,"std::abs(cx - dx)","3e-3",(float *)&local_150,
               (double *)&local_168);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_168);
      std::operator<<((ostream *)(local_168.ptr_ + 0x10),"Closed form = ");
      std::ostream::operator<<(local_168.ptr_ + 0x10,local_15c);
      std::operator<<((ostream *)(local_168.ptr_ + 0x10),", distrib = ");
      std::ostream::operator<<(local_168.ptr_ + 0x10,local_160);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x2f9,pcVar3);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_168);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_168.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x3f689374bc6a7efa;
    auVar1._8_4_ = 0x7fffffff;
    auVar1._0_8_ = 0x7fffffff7fffffff;
    auVar1._12_4_ = 0x7fffffff;
    auVar4 = vandps_avx512vl(ZEXT416((uint)(cp - dp)),auVar1);
    local_150.data_._0_4_ = auVar4._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&gtest_ar,"std::abs(cp - dp)","3e-3",(float *)&local_150,
               (double *)&local_168);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_168);
      std::operator<<((ostream *)(local_168.ptr_ + 0x10),"Closed form PDF = ");
      std::ostream::operator<<(local_168.ptr_ + 0x10,cp);
      std::operator<<((ostream *)(local_168.ptr_ + 0x10),", distrib PDF = ");
      std::ostream::operator<<(local_168.ptr_ + 0x10,dp);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x2fb,pcVar3);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_168);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  pbrt::PiecewiseConstant1D::~PiecewiseConstant1D(&distrib);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&cdf.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&values.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&nodes.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

TEST(Sampling, CatmullRom) {
    std::vector<Float> nodes = {Float(0), Float(.1), Float(.4), Float(.88), Float(1)};
    std::vector<Float> values = {Float(0), Float(5), Float(2), Float(10), Float(5)};
    std::vector<Float> cdf(values.size());

    IntegrateCatmullRom(nodes, values, pstd::span<Float>(cdf));

    auto cr = [&](Float v) { return CatmullRom(nodes, values, v); };
    PiecewiseConstant1D distrib(Sample1DFunction(cr, 8192, 1024, 0.f, 1.f));
    for (Float u : Uniform1D(100)) {
        Float cp;
        Float cx = SampleCatmullRom(nodes, values, cdf, u, nullptr, &cp);

        Float dp;
        Float dx = distrib.Sample(u, &dp);
        EXPECT_LT(std::abs(cx - dx), 3e-3)
            << "Closed form = " << cx << ", distrib = " << dx;
        EXPECT_LT(std::abs(cp - dp), 3e-3)
            << "Closed form PDF = " << cp << ", distrib PDF = " << dp;
    }
}